

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O2

bool __thiscall
S2BooleanOperation::Impl::GetChainStarts
          (Impl *this,int a_region_id,bool invert_a,bool invert_b,bool invert_result,
          CrossingProcessor *cp,
          vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> *chain_starts)

{
  S2BooleanOperation *pSVar1;
  S2ShapeIndex *pSVar2;
  S2ShapeIndex *index;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  int extraout_var_00;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  S2ContainsPointQuery<S2ShapeIndex> local_b0;
  ShapeEdgeId local_98;
  VType VStack_90;
  VType local_88;
  VType VStack_80;
  VType local_78;
  VType VStack_70;
  ShapeEdge a;
  S2Shape *pSVar9;
  
  pSVar1 = this->op_;
  pSVar2 = pSVar1->regions_[a_region_id];
  index = pSVar1->regions_[1 - a_region_id];
  if (pSVar1->result_empty_ != (bool *)0x0) {
    CrossingProcessor::StartBoundary(cp,a_region_id,invert_a,invert_b,invert_result);
  }
  bVar3 = HasInterior(index);
  if ((bVar3 || invert_b) || (this->op_->result_empty_ != (bool *)0x0)) {
    local_b0.options_.vertex_model_ = SEMI_OPEN;
    local_b0.index_ = index;
    (*index->_vptr_S2ShapeIndex[6])(&local_b0.it_,index,2);
    uVar5 = (*pSVar2->_vptr_S2ShapeIndex[2])();
    uVar11 = 0;
    uVar10 = 0;
    if (0 < (int)uVar5) {
      uVar10 = uVar5;
    }
    for (; uVar11 != uVar10; uVar11 = uVar11 + 1) {
      iVar6 = (*pSVar2->_vptr_S2ShapeIndex[3])(pSVar2,(ulong)uVar11);
      pSVar9 = (S2Shape *)CONCAT44(extraout_var,iVar6);
      if ((pSVar9 != (S2Shape *)0x0) &&
         ((invert_a == invert_result || (iVar6 = (*pSVar9->_vptr_S2Shape[4])(pSVar9), 1 < iVar6))))
      {
        if (this->op_->result_empty_ != (bool *)0x0) {
          cp->a_shape_ = pSVar9;
          iVar6 = (*pSVar9->_vptr_S2Shape[4])(pSVar9);
          cp->a_dimension_ = iVar6;
        }
        uVar7 = (*pSVar9->_vptr_S2Shape[6])(pSVar9);
        uVar13 = 0;
        uVar12 = (ulong)uVar7;
        if ((int)uVar7 < 1) {
          uVar12 = uVar13;
        }
        while (iVar6 = (int)uVar13, (int)uVar12 != iVar6) {
          iVar8 = (*pSVar9->_vptr_S2Shape[7])(pSVar9,uVar13);
          if (extraout_var_00 != 0) {
            (*pSVar9->_vptr_S2Shape[8])(&local_98,pSVar9,uVar13,0);
            a.edge_.v0.c_[0] = (VType)CONCAT44(local_98.edge_id,local_98.shape_id);
            a.edge_.v1.c_[1] = local_78;
            a.edge_.v1.c_[2] = VStack_70;
            a.edge_.v0.c_[2] = local_88;
            a.edge_.v1.c_[0] = VStack_80;
            a.edge_.v0.c_[1] = VStack_90;
            a.id_.shape_id = uVar11;
            a.id_.edge_id = iVar8;
            if (bVar3) {
              bVar4 = S2ContainsPointQuery<S2ShapeIndex>::Contains(&local_b0,&a.edge_.v0);
              if (bVar4 == invert_b) goto LAB_001e70db;
LAB_001e70e6:
              local_98.shape_id = uVar11;
              local_98.edge_id = iVar8;
              std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::
              emplace_back<s2shapeutil::ShapeEdgeId>(chain_starts,&local_98);
              bVar4 = true;
            }
            else {
              if (invert_b) goto LAB_001e70e6;
LAB_001e70db:
              bVar4 = false;
            }
            if (this->op_->result_empty_ != (bool *)0x0) {
              cp->chain_id_ = iVar6;
              cp->chain_start_ = iVar8;
              cp->chain_limit_ = extraout_var_00 + iVar8;
              cp->inside_ = bVar4;
              cp->v0_emitted_max_edge_id_ = iVar8 + -1;
              cp->chain_v0_emitted_ = false;
              bVar4 = ProcessIncidentEdges(this,&a,&local_b0,cp);
              if (!bVar4) goto LAB_001e7166;
            }
          }
          uVar13 = (ulong)(iVar6 + 1);
        }
      }
    }
LAB_001e7166:
    if (local_b0.it_.iter_._M_t.
        super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
        ._M_t.
        super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
        .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl !=
        (__uniq_ptr_data<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>,_true,_true>
         )0x0) {
      (*(*(_func_int ***)
          local_b0.it_.iter_._M_t.
          super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
          .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)[1])();
    }
    if ((int)uVar11 < (int)uVar5) {
      return false;
    }
  }
  std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::push_back
            (chain_starts,&kSentinel);
  return true;
}

Assistant:

bool S2BooleanOperation::Impl::GetChainStarts(
    int a_region_id, bool invert_a, bool invert_b, bool invert_result,
    CrossingProcessor* cp, vector<ShapeEdgeId>* chain_starts) {
  const S2ShapeIndex& a_index = *op_->regions_[a_region_id];
  const S2ShapeIndex& b_index = *op_->regions_[1 - a_region_id];

  if (is_boolean_output()) {
    // If boolean output is requested, then we use the CrossingProcessor to
    // determine whether the first edge of each chain will be emitted to the
    // output region.  This lets us terminate the operation early in many
    // cases.
    cp->StartBoundary(a_region_id, invert_a, invert_b, invert_result);
  }

  // If region B has no two-dimensional shapes and is not inverted, then by
  // definition no chain starts are contained.  However if boolean output is
  // requested then we check for containment anyway, since as a side effect we
  // may discover that the result region is non-empty and terminate the entire
  // operation early.
  bool b_has_interior = HasInterior(b_index);
  if (b_has_interior || invert_b || is_boolean_output()) {
    auto query = MakeS2ContainsPointQuery(&b_index);
    int num_shape_ids = a_index.num_shape_ids();
    for (int shape_id = 0; shape_id < num_shape_ids; ++shape_id) {
      S2Shape* a_shape = a_index.shape(shape_id);
      if (a_shape == nullptr) continue;

      // If region A is being subtracted from region B, points and polylines
      // in region A can be ignored since these shapes never contribute to the
      // output (they can only remove edges from region B).
      if (invert_a != invert_result && a_shape->dimension() < 2) continue;

      if (is_boolean_output()) cp->StartShape(a_shape);
      int num_chains = a_shape->num_chains();
      for (int chain_id = 0; chain_id < num_chains; ++chain_id) {
        S2Shape::Chain chain = a_shape->chain(chain_id);
        if (chain.length == 0) continue;
        ShapeEdge a(shape_id, chain.start, a_shape->chain_edge(chain_id, 0));
        bool inside = (b_has_interior && query.Contains(a.v0())) != invert_b;
        if (inside) {
          chain_starts->push_back(ShapeEdgeId(shape_id, chain.start));
        }
        if (is_boolean_output()) {
          cp->StartChain(chain_id, chain, inside);
          if (!ProcessIncidentEdges(a, &query, cp)) return false;
        }
      }
    }
  }
  chain_starts->push_back(kSentinel);
  return true;
}